

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::shiftSignificandLeft(IEEEFloat *this,uint bits)

{
  bool bVar1;
  uint Words;
  integerPart *piVar2;
  uint partsCount;
  uint bits_local;
  IEEEFloat *this_local;
  
  if (this->semantics->precision <= bits) {
    __assert_fail("bits < semantics->precision",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x498,"void llvm::detail::IEEEFloat::shiftSignificandLeft(unsigned int)");
  }
  if (bits != 0) {
    Words = partCount(this);
    piVar2 = significandParts(this);
    APInt::tcShiftLeft(piVar2,Words,bits);
    this->exponent = this->exponent - (short)bits;
    piVar2 = significandParts(this);
    bVar1 = APInt::tcIsZero(piVar2,Words);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!APInt::tcIsZero(significandParts(), partsCount)",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x4a0,"void llvm::detail::IEEEFloat::shiftSignificandLeft(unsigned int)");
    }
  }
  return;
}

Assistant:

void IEEEFloat::shiftSignificandLeft(unsigned int bits) {
  assert(bits < semantics->precision);

  if (bits) {
    unsigned int partsCount = partCount();

    APInt::tcShiftLeft(significandParts(), partsCount, bits);
    exponent -= bits;

    assert(!APInt::tcIsZero(significandParts(), partsCount));
  }
}